

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O3

uchar ** traverse<void(*)(unsigned_char**,int,int),std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
                   (TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                    *node,uchar **dst,size_t depth,_func_void_uchar_ptr_ptr_int_int *small_sort)

{
  undefined8 *puVar1;
  void *__src;
  TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_> *node_00;
  size_t __n;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket;
  pointer ppvVar2;
  ulong uVar3;
  long lVar4;
  
  ppvVar2 = (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppvVar2) {
    uVar3 = 0;
    do {
      puVar1 = (undefined8 *)ppvVar2[uVar3];
      if (((ulong)puVar1 & 1) == 0) {
        if (puVar1 != (undefined8 *)0x0) {
          __src = (void *)*puVar1;
          lVar4 = puVar1[1];
          __n = lVar4 - (long)__src;
          if (__n != 0) {
            memmove(dst,__src,__n);
          }
          lVar4 = lVar4 - (long)__src >> 3;
          if ((char)uVar3 != '\0') {
            mkqsort(dst,(int)lVar4,(int)depth);
          }
          if ((void *)*puVar1 != (void *)0x0) {
            operator_delete((void *)*puVar1);
          }
          dst = dst + lVar4;
          operator_delete(puVar1);
        }
      }
      else {
        node_00 = TrieNode<unsigned_char,_std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>_>
                  ::get_node(node,(uint)uVar3);
        dst = traverse<void(*)(unsigned_char**,int,int),std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
                        (node_00,dst,depth + 1,small_sort);
      }
      uVar3 = (ulong)((uint)uVar3 + 1);
      ppvVar2 = (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(node->_buckets).
                                   super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)ppvVar2 >> 3));
  }
  if (ppvVar2 != (pointer)0x0) {
    operator_delete(ppvVar2);
  }
  operator_delete(node);
  return dst;
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT, BucketT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < node->_buckets.size(); ++i) {
		if (node->is_trie(i)) {
			dst = traverse(node->get_node(i),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->_buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}